

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::pumpLoop
          (AsyncIoStreamWithInitialBuffer *this,AsyncOutputStream *output,uint64_t remaining,
          uint64_t total)

{
  uint64_t uVar1;
  size_t sVar2;
  AsyncIoStream *pAVar3;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> in_R8;
  Promise<unsigned_long> local_a8 [3];
  AsyncOutputStream *local_90;
  uint64_t local_88;
  uint64_t local_80;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> local_78;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> local_70;
  ArrayPtr<unsigned_char> local_68;
  ArrayPtr<const_unsigned_char> local_58;
  AsyncOutputStream *local_40;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> local_38;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long_&>_> bytesToWrite;
  uint64_t total_local;
  uint64_t remaining_local;
  AsyncOutputStream *output_local;
  AsyncIoStreamWithInitialBuffer *this_local;
  
  bytesToWrite = in_R8;
  total_local = total;
  remaining_local = remaining;
  output_local = output;
  this_local = this;
  sVar2 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(output + 7));
  if (sVar2 == 0) {
    pAVar3 = Own<kj::AsyncIoStream,_std::nullptr_t>::operator->
                       ((Own<kj::AsyncIoStream,_std::nullptr_t> *)(output + 2));
    (*(pAVar3->super_AsyncInputStream)._vptr_AsyncInputStream[3])
              (local_a8,pAVar3,remaining_local,total_local);
    Promise<unsigned_long>::
    then<kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda(auto:1)_1_>
              ((Promise<unsigned_long> *)this,(Type *)local_a8);
    Promise<unsigned_long>::~Promise(local_a8);
  }
  else {
    local_40 = (AsyncOutputStream *)
               ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)(output + 7));
    local_38 = min<unsigned_long,unsigned_long&>
                         ((unsigned_long *)&stack0xffffffffffffffc0,&total_local);
    uVar1 = remaining_local;
    local_68 = ArrayPtr<unsigned_char>::first((ArrayPtr<unsigned_char> *)(output + 7),local_38);
    local_58 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_68);
    (*(code *)**(undefined8 **)uVar1)
              ((Type *)&stack0xffffffffffffffb8,uVar1,local_58.ptr,local_58.size_);
    local_88 = remaining_local;
    local_80 = total_local;
    local_78 = bytesToWrite;
    local_70 = local_38;
    local_90 = output;
    Promise<void>::
    then<kj::AsyncIoStreamWithInitialBuffer::pumpLoop(kj::AsyncOutputStream&,unsigned_long,unsigned_long)::_lambda()_1_>
              ((Promise<void> *)this,(Type *)&stack0xffffffffffffffb8);
    Promise<void>::~Promise((Promise<void> *)&stack0xffffffffffffffb8);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<uint64_t> pumpLoop(
      kj::AsyncOutputStream& output,
      uint64_t remaining,
      uint64_t total) {
    // If there is any data remaining in the leftover queue, we'll write it out first to output.
    if (leftover.size() > 0) {
      auto bytesToWrite = kj::min(leftover.size(), remaining);
      return output.write(leftover.first(bytesToWrite)).then(
          [this, &output, remaining, total, bytesToWrite]() mutable -> kj::Promise<uint64_t> {
        leftover = leftover.slice(bytesToWrite, leftover.size());
        // If the leftover buffer has been fully consumed, go ahead and free it now.
        if (leftover.size() == 0) {
          leftoverBackingBuffer = nullptr;
        }
        remaining -= bytesToWrite;
        total += bytesToWrite;

        if (remaining == 0) {
          return total;
        }
        return pumpLoop(output, remaining, total);
      });
    } else {
      // Otherwise, we are just going to defer to stream's pumpTo, making sure to
      // account for the total amount we've already written from the leftover queue.
      return stream->pumpTo(output, remaining).then([total](auto read) {
        return total + read;
      });
    }
  }